

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_integer_sequence.cpp
# Opt level: O0

void encode_ise(quant_method quant_level,uint character_count,uint8_t *input_data,
               uint8_t *output_data,uint bit_offset)

{
  value_type vVar1;
  value_type vVar2;
  byte bVar3;
  byte bVar4;
  uint bitcount;
  const_reference pvVar5;
  uint8_t *in_RCX;
  uint uVar6;
  long in_RDX;
  uint in_ESI;
  uint in_R8D;
  uint i_2;
  uint8_t pack_3;
  uint j_3;
  uint8_t T_3;
  uint i0_3;
  uint i1_3;
  uint i2_3;
  uint8_t pack_2;
  uint8_t T_2;
  uint i0_2;
  uint i1_2;
  uint i2_2;
  uint j_2;
  uint full_quint_blocks;
  uint i_1;
  uint8_t pack_1;
  uint j_1;
  uint8_t T_1;
  uint i0_1;
  uint i1_1;
  uint i2_1;
  uint i3_1;
  uint i4_1;
  uint8_t pack;
  uint8_t T;
  uint i0;
  uint i1;
  uint i2;
  uint i3;
  uint i4;
  uint j;
  uint full_trit_blocks;
  uint i;
  uint mask;
  uint quints;
  uint trits;
  uint bits;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff54;
  uint local_a8;
  uint local_a0;
  uint local_7c;
  uint local_74;
  uint local_6c;
  uint local_38;
  uint local_30;
  uint local_1c;
  
  if (in_ESI == 0) {
    __assert_fail("character_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_integer_sequence.cpp"
                  ,500,
                  "void encode_ise(quant_method, unsigned int, const uint8_t *, uint8_t *, unsigned int)"
                 );
  }
  pvVar5 = std::array<btq_count,_21UL>::operator[]
                     ((array<btq_count,_21UL> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  vVar1 = *pvVar5;
  bitcount = (uint)((byte)vVar1 & 0x3f);
  pvVar5 = std::array<btq_count,_21UL>::operator[]
                     ((array<btq_count,_21UL> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  vVar2 = *pvVar5;
  pvVar5 = std::array<btq_count,_21UL>::operator[]
                     ((array<btq_count,_21UL> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  bVar4 = (char)(1 << ((byte)vVar1 & 0x1f)) - 1;
  local_1c = in_R8D;
  if (((byte)vVar2 >> 6 & 1) == 0) {
    if ((char)*pvVar5 < '\0') {
      local_74 = 0;
      for (local_7c = 0; local_7c < in_ESI / 3; local_7c = local_7c + 1) {
        bVar3 = integer_of_quints
                [(uint)((int)(uint)*(byte *)(in_RDX + (ulong)(local_74 + 2)) >> ((byte)vVar1 & 0x1f)
                       )][(uint)((int)(uint)*(byte *)(in_RDX + (ulong)(local_74 + 1)) >>
                                ((byte)vVar1 & 0x1f))]
                [(uint)((int)(uint)*(byte *)(in_RDX + (ulong)local_74) >> ((byte)vVar1 & 0x1f))];
        write_bits((uint)(byte)(*(byte *)(in_RDX + (ulong)local_74) & bVar4 |
                               (byte)((bVar3 & 7) << ((byte)vVar1 & 0x1f))),bitcount + 3,local_1c,
                   in_RCX);
        local_1c = bitcount + 3 + local_1c;
        uVar6 = local_74 + 2;
        write_bits((uint)(byte)(*(byte *)(in_RDX + (ulong)(local_74 + 1)) & bVar4 |
                               (byte)(((int)(uint)bVar3 >> 3 & 3U) << ((byte)vVar1 & 0x1f))),
                   bitcount + 2,local_1c,in_RCX);
        local_1c = bitcount + 2 + local_1c;
        local_74 = local_74 + 3;
        write_bits((uint)(byte)(*(byte *)(in_RDX + (ulong)uVar6) & bVar4 |
                               (byte)(((int)(uint)bVar3 >> 5 & 3U) << ((byte)vVar1 & 0x1f))),
                   bitcount + 2,local_1c,in_RCX);
        local_1c = bitcount + 2 + local_1c;
      }
      if (local_74 != in_ESI) {
        if (local_74 + 1 < in_ESI) {
          uVar6 = (int)(uint)*(byte *)(in_RDX + (ulong)(local_74 + 1)) >> ((byte)vVar1 & 0x1f);
        }
        else {
          uVar6 = 0;
        }
        bVar3 = integer_of_quints[0][uVar6]
                [(uint)((int)(uint)*(byte *)(in_RDX + (ulong)local_74) >> ((byte)vVar1 & 0x1f))];
        local_a0 = 0;
        for (; local_74 < in_ESI; local_74 = local_74 + 1) {
          write_bits((uint)(byte)(*(byte *)(in_RDX + (ulong)local_74) & bVar4 |
                                 (byte)(((int)(uint)bVar3 >> (""[local_a0] & 0x1f) &
                                        (1 << ("\x03\x02"[local_a0] & 0x1f)) - 1U) <<
                                       ((byte)vVar1 & 0x1f))),bitcount + "\x03\x02"[local_a0],
                     local_1c,in_RCX);
          local_1c = bitcount + "\x03\x02"[local_a0] + local_1c;
          local_a0 = local_a0 + 1;
        }
      }
    }
    else {
      for (local_a8 = 0; local_a8 < in_ESI; local_a8 = local_a8 + 1) {
        write_bits((uint)*(byte *)(in_RDX + (ulong)local_a8),bitcount,local_1c,in_RCX);
        local_1c = bitcount + local_1c;
      }
    }
  }
  else {
    local_30 = 0;
    for (local_38 = 0; local_38 < in_ESI / 5; local_38 = local_38 + 1) {
      bVar3 = integer_of_trits
              [(uint)((int)(uint)*(byte *)(in_RDX + (ulong)(local_30 + 4)) >> ((byte)vVar1 & 0x1f))]
              [(uint)((int)(uint)*(byte *)(in_RDX + (ulong)(local_30 + 3)) >> ((byte)vVar1 & 0x1f))]
              [(uint)((int)(uint)*(byte *)(in_RDX + (ulong)(local_30 + 2)) >> ((byte)vVar1 & 0x1f))]
              [(uint)((int)(uint)*(byte *)(in_RDX + (ulong)(local_30 + 1)) >> ((byte)vVar1 & 0x1f))]
              [(uint)((int)(uint)*(byte *)(in_RDX + (ulong)local_30) >> ((byte)vVar1 & 0x1f))];
      write_bits((uint)(byte)(*(byte *)(in_RDX + (ulong)local_30) & bVar4 |
                             (byte)((bVar3 & 3) << ((byte)vVar1 & 0x1f))),bitcount + 2,local_1c,
                 in_RCX);
      local_1c = bitcount + 2 + local_1c;
      write_bits((uint)(byte)(*(byte *)(in_RDX + (ulong)(local_30 + 1)) & bVar4 |
                             (byte)(((int)(uint)bVar3 >> 2 & 3U) << ((byte)vVar1 & 0x1f))),
                 bitcount + 2,local_1c,in_RCX);
      local_1c = bitcount + 2 + local_1c;
      write_bits((uint)(byte)(*(byte *)(in_RDX + (ulong)(local_30 + 2)) & bVar4 |
                             (byte)(((int)(uint)bVar3 >> 4 & 1U) << ((byte)vVar1 & 0x1f))),
                 bitcount + 1,local_1c,in_RCX);
      local_1c = bitcount + 1 + local_1c;
      uVar6 = local_30 + 4;
      write_bits((uint)(byte)(*(byte *)(in_RDX + (ulong)(local_30 + 3)) & bVar4 |
                             (byte)(((int)(uint)bVar3 >> 5 & 3U) << ((byte)vVar1 & 0x1f))),
                 bitcount + 2,local_1c,in_RCX);
      local_1c = bitcount + 2 + local_1c;
      local_30 = local_30 + 5;
      write_bits((uint)(byte)(*(byte *)(in_RDX + (ulong)uVar6) & bVar4 |
                             (byte)(((int)(uint)bVar3 >> 7) << ((byte)vVar1 & 0x1f))),bitcount + 1,
                 local_1c,in_RCX);
      local_1c = bitcount + 1 + local_1c;
    }
    if (local_30 != in_ESI) {
      if (local_30 + 3 < in_ESI) {
        uVar6 = (int)(uint)*(byte *)(in_RDX + (ulong)(local_30 + 3)) >> ((byte)vVar1 & 0x1f);
      }
      else {
        uVar6 = 0;
      }
      if (local_30 + 2 < in_ESI) {
        uVar8 = (int)(uint)*(byte *)(in_RDX + (ulong)(local_30 + 2)) >> ((byte)vVar1 & 0x1f);
      }
      else {
        uVar8 = 0;
      }
      if (local_30 + 1 < in_ESI) {
        uVar7 = (int)(uint)*(byte *)(in_RDX + (ulong)(local_30 + 1)) >> ((byte)vVar1 & 0x1f);
      }
      else {
        uVar7 = 0;
      }
      bVar3 = integer_of_trits[0][uVar6][uVar8][uVar7]
              [(uint)((int)(uint)*(byte *)(in_RDX + (ulong)local_30) >> ((byte)vVar1 & 0x1f))];
      local_6c = 0;
      for (; local_30 < in_ESI; local_30 = local_30 + 1) {
        write_bits((uint)(byte)(*(byte *)(in_RDX + (ulong)local_30) & bVar4 |
                               (byte)(((int)(uint)bVar3 >> (""[local_6c] & 0x1f) &
                                      (1 << ("\x02\x02\x01\x02"[local_6c] & 0x1f)) - 1U) <<
                                     ((byte)vVar1 & 0x1f))),bitcount + "\x02\x02\x01\x02"[local_6c],
                   local_1c,in_RCX);
        local_1c = bitcount + "\x02\x02\x01\x02"[local_6c] + local_1c;
        local_6c = local_6c + 1;
      }
    }
  }
  return;
}

Assistant:

void encode_ise(
	quant_method quant_level,
	unsigned int character_count,
	const uint8_t* input_data,
	uint8_t* output_data,
	unsigned int bit_offset
) {
	promise(character_count > 0);

	unsigned int bits = btq_counts[quant_level].bits;
	unsigned int trits = btq_counts[quant_level].trits;
	unsigned int quints = btq_counts[quant_level].quints;
	unsigned int mask = (1 << bits) - 1;

	// Write out trits and bits
	if (trits)
	{
		unsigned int i = 0;
		unsigned int full_trit_blocks = character_count / 5;

		for (unsigned int j = 0; j < full_trit_blocks; j++)
		{
			unsigned int i4 = input_data[i + 4] >> bits;
			unsigned int i3 = input_data[i + 3] >> bits;
			unsigned int i2 = input_data[i + 2] >> bits;
			unsigned int i1 = input_data[i + 1] >> bits;
			unsigned int i0 = input_data[i + 0] >> bits;

			uint8_t T = integer_of_trits[i4][i3][i2][i1][i0];

			// The max size of a trit bit count is 6, so we can always safely
			// pack a single MX value with the following 1 or 2 T bits.
			uint8_t pack;

			// Element 0 + T0 + T1
			pack = (input_data[i++] & mask) | (((T >> 0) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 1 + T2 + T3
			pack = (input_data[i++] & mask) | (((T >> 2) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 2 + T4
			pack = (input_data[i++] & mask) | (((T >> 4) & 0x1) << bits);
			write_bits(pack, bits + 1, bit_offset, output_data);
			bit_offset += bits + 1;

			// Element 3 + T5 + T6
			pack = (input_data[i++] & mask) | (((T >> 5) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 4 + T7
			pack = (input_data[i++] & mask) | (((T >> 7) & 0x1) << bits);
			write_bits(pack, bits + 1, bit_offset, output_data);
			bit_offset += bits + 1;
		}

		// Loop tail for a partial block
		if (i != character_count)
		{
			// i4 cannot be present - we know the block is partial
			// i0 must be present - we know the block isn't empty
			unsigned int i4 =                            0;
			unsigned int i3 = i + 3 >= character_count ? 0 : input_data[i + 3] >> bits;
			unsigned int i2 = i + 2 >= character_count ? 0 : input_data[i + 2] >> bits;
			unsigned int i1 = i + 1 >= character_count ? 0 : input_data[i + 1] >> bits;
			unsigned int i0 =                                input_data[i + 0] >> bits;

			uint8_t T = integer_of_trits[i4][i3][i2][i1][i0];

			for (unsigned int j = 0; i < character_count; i++, j++)
			{
				// Truncated table as this iteration is always partital
				static const uint8_t tbits[4]  { 2, 2, 1, 2 };
				static const uint8_t tshift[4] { 0, 2, 4, 5 };

				uint8_t pack = (input_data[i] & mask) |
				               (((T >> tshift[j]) & ((1 << tbits[j]) - 1)) << bits);

				write_bits(pack, bits + tbits[j], bit_offset, output_data);
				bit_offset += bits + tbits[j];
			}
		}
	}
	// Write out quints and bits
	else if (quints)
	{
		unsigned int i = 0;
		unsigned int full_quint_blocks = character_count / 3;

		for (unsigned int j = 0; j < full_quint_blocks; j++)
		{
			unsigned int i2 = input_data[i + 2] >> bits;
			unsigned int i1 = input_data[i + 1] >> bits;
			unsigned int i0 = input_data[i + 0] >> bits;

			uint8_t T = integer_of_quints[i2][i1][i0];

			// The max size of a quint bit count is 5, so we can always safely
			// pack a single M value with the following 2 or 3 T bits.
			uint8_t pack;

			// Element 0
			pack = (input_data[i++] & mask) | (((T >> 0) & 0x7) << bits);
			write_bits(pack, bits + 3, bit_offset, output_data);
			bit_offset += bits + 3;

			// Element 1
			pack = (input_data[i++] & mask) | (((T >> 3) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 2
			pack = (input_data[i++] & mask) | (((T >> 5) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;
		}

		// Loop tail for a partial block
		if (i != character_count)
		{
			// i2 cannot be present - we know the block is partial
			// i0 must be present - we know the block isn't empty
			unsigned int i2 =                            0;
			unsigned int i1 = i + 1 >= character_count ? 0 : input_data[i + 1] >> bits;
			unsigned int i0 =                                input_data[i + 0] >> bits;

			uint8_t T = integer_of_quints[i2][i1][i0];

			for (unsigned int j = 0; i < character_count; i++, j++)
			{
				// Truncated table as this iteration is always partital
				static const uint8_t tbits[2]  { 3, 2 };
				static const uint8_t tshift[2] { 0, 3 };

				uint8_t pack = (input_data[i] & mask) |
				               (((T >> tshift[j]) & ((1 << tbits[j]) - 1)) << bits);

				write_bits(pack, bits + tbits[j], bit_offset, output_data);
				bit_offset += bits + tbits[j];
			}
		}
	}
	// Write out just bits
	else
	{
		for (unsigned int i = 0; i < character_count; i++)
		{
			write_bits(input_data[i], bits, bit_offset, output_data);
			bit_offset += bits;
		}
	}
}